

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

void __thiscall QHttpNetworkReplyPrivate::clearHttpLayerInformation(QHttpNetworkReplyPrivate *this)

{
  this->state = NothingDoneState;
  this->lastChunkRead = false;
  this->bodyLength = 0;
  this->contentRead = 0;
  this->totalProgress = 0;
  this->currentChunkSize = 0;
  this->currentChunkRead = 0;
  this->connectionCloseEnabled = true;
  QHttpHeaderParser::clear(&(this->super_QHttpNetworkHeaderPrivate).parser);
  return;
}

Assistant:

void QHttpNetworkReplyPrivate::clearHttpLayerInformation()
{
    state = NothingDoneState;
    bodyLength = 0;
    contentRead = 0;
    totalProgress = 0;
    currentChunkSize = 0;
    currentChunkRead = 0;
    lastChunkRead = false;
    connectionCloseEnabled = true;
    parser.clear();
}